

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgdessll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG nrows,LONGLONG *length,
             LONGLONG *heapaddr,int *status)

{
  int iVar1;
  long *values;
  long in_RCX;
  int in_ESI;
  int *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  int unaff_retaddr;
  tcolumn *colptr;
  LONGLONG descript8 [2];
  uint descript4 [2];
  long ii;
  LONGLONG bytepos;
  LONGLONG rowsize;
  int *in_stack_00000090;
  fitsfile *in_stack_00000098;
  int *in_stack_ffffffffffffff88;
  ulong in_stack_ffffffffffffff98;
  ulong in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  fitsfile *pfVar2;
  ulong *local_38;
  ulong *local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  memset(&stack0xffffffffffffffa8,0,8);
  memset(&stack0xffffffffffffff98,0,0x10);
  if (*(int *)colptr->ttype < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_00000098,in_stack_00000090), 0 < iVar1)) {
        return *(int *)colptr->ttype;
      }
    }
    else {
      ffmahd((fitsfile *)colptr,unaff_retaddr,
             (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    values = (long *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0);
    if ((int)values[10] < 0) {
      local_38 = in_R9;
      local_30 = in_R8;
      if ((*(char *)((long)values + 0x8c) == 'P') || (*(char *)((long)values + 0x8d) == 'P')) {
        for (pfVar2 = (fitsfile *)0x0; (long)pfVar2 < in_RCX;
            pfVar2 = (fitsfile *)((long)&pfVar2->HDUposition + 1)) {
          iVar1 = ffgi4b(pfVar2,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(int *)values,
                         in_stack_ffffffffffffff88);
          if (0 < iVar1) {
            return *(int *)colptr->ttype;
          }
          if (local_30 != (ulong *)0x0) {
            *local_30 = (ulong)in_stack_ffffffffffffffa8;
            local_30 = local_30 + 1;
          }
          if (local_38 != (ulong *)0x0) {
            *local_38 = (ulong)in_stack_ffffffffffffffac;
            local_38 = local_38 + 1;
          }
        }
      }
      else {
        for (pfVar2 = (fitsfile *)0x0; (long)pfVar2 < in_RCX;
            pfVar2 = (fitsfile *)((long)&pfVar2->HDUposition + 1)) {
          iVar1 = ffgi8b(pfVar2,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,values,
                         in_stack_ffffffffffffff88);
          if (0 < iVar1) {
            return *(int *)colptr->ttype;
          }
          if (local_30 != (ulong *)0x0) {
            *local_30 = in_stack_ffffffffffffff98;
            local_30 = local_30 + 1;
          }
          if (local_38 != (ulong *)0x0) {
            *local_38 = in_stack_ffffffffffffffa0;
            local_38 = local_38 + 1;
          }
        }
      }
      iVar1 = *(int *)colptr->ttype;
    }
    else {
      colptr->ttype[0] = '=';
      colptr->ttype[1] = '\x01';
      colptr->ttype[2] = '\0';
      colptr->ttype[3] = '\0';
      iVar1 = *(int *)colptr->ttype;
    }
  }
  else {
    iVar1 = *(int *)colptr->ttype;
  }
  return iVar1;
}

Assistant:

int ffgdessll(fitsfile *fptr, /* I - FITS file pointer                      */
           int colnum,     /* I - column number (1 = 1st column of table)   */
           LONGLONG firstrow,  /* I - first row  (1 = 1st row of table)         */
           LONGLONG nrows,     /* I - number or rows to read                    */
           LONGLONG *length,   /* O - number of elements in the row         */
           LONGLONG *heapaddr, /* O - heap pointer to the data              */
           int *status)    /* IO - error status                             */
/*
  get (read) a range of variable length vector descriptors from the table.
*/
{
    LONGLONG rowsize, bytepos;
    long  ii;
    unsigned int descript4[2] = {0,0};
    LONGLONG descript8[2] = {0,0};
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);           /* offset to the correct column */

    if (colptr->tdatatype >= 0) {
        *status = NOT_VARI_LEN;
        return(*status);
    }

    rowsize = (fptr->Fptr)->rowlength;
    bytepos = (fptr->Fptr)->datastart + 
                  (rowsize  * (firstrow - 1)) +
                  colptr->tbcol;

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        /* read 4-byte descriptors */
        for (ii = 0; ii < nrows; ii++)
        {
	    /* read descriptors */
            if (ffgi4b(fptr, bytepos, 2, 4, (INT32BIT *) descript4, status) <= 0)
	    { 
              if (length) {
                *length =   (LONGLONG) descript4[0];   /* 1st word is the length  */
                length++;
	      }

              if (heapaddr) {
                *heapaddr = (LONGLONG) descript4[1];   /* 2nd word is the address */
                heapaddr++;
	      }
              bytepos += rowsize;
	    }
	    else
	      return(*status);
        }
    }
    else  /* this is for 'Q' columns */
    {
        /* read 8-byte descriptors */
        for (ii = 0; ii < nrows; ii++)
        {
	    /* read descriptors */
	    /* cast to type (long *) even though it is actually (LONGLONG *) */
            if (ffgi8b(fptr, bytepos, 2, 8, (long *) descript8, status) <= 0)
	    { 
              if (length) {
                *length =   descript8[0];   /* 1st word is the length  */
                length++;
	      }

              if (heapaddr) {
                *heapaddr = descript8[1];   /* 2nd word is the address */
                heapaddr++;
	      }
              bytepos += rowsize;
	    }
	    else
	      return(*status);
        }
    }
    return(*status);
}